

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_st_generator.cc
# Opt level: O3

string * __thiscall
t_st_generator::write_val
          (string *__return_storage_ptr__,t_st_generator *this,t_type *t,string *fname)

{
  pointer pcVar1;
  long lVar2;
  int iVar3;
  t_struct *tstruct;
  undefined8 *puVar4;
  long *plVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr___00;
  size_type *psVar6;
  long *plVar7;
  _Alloc_hider _Var8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_150;
  size_type local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  long *local_130;
  long local_128;
  long local_120;
  long lStack_118;
  string local_110;
  string local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d0;
  size_type local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  tstruct = (t_struct *)t_type::get_true_type(t);
  iVar3 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[5])(tstruct);
  if ((char)iVar3 == '\0') {
    iVar3 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[0x10])(tstruct);
    if ((char)iVar3 == '\0') {
      iVar3 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[0xb])(tstruct);
      if (((char)iVar3 == '\0') &&
         (iVar3 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[0xc])(tstruct),
         (char)iVar3 == '\0')) {
        iVar3 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[0xe])(tstruct);
        if ((char)iVar3 == '\0') {
          iVar3 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[0xf])(tstruct);
          if ((char)iVar3 == '\0') {
            iVar3 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[10])(tstruct);
            if ((char)iVar3 != '\0') {
              std::operator+(__return_storage_ptr__,"iprot writeI32: ",fname);
              return __return_storage_ptr__;
            }
            __return_storage_ptr___00 =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __cxa_allocate_exception(0x20);
            type_name_abi_cxx11_(&local_170,this,(t_type *)tstruct);
            std::operator+(__return_storage_ptr___00,"Sorry, I don\'t know how to write this: ",
                           &local_170);
            __cxa_throw(__return_storage_ptr___00,&std::__cxx11::string::typeinfo,
                        std::__cxx11::string::~string);
          }
          paVar9 = &local_b0.field_2;
          pcVar1 = (fname->_M_dataplus)._M_p;
          local_b0._M_dataplus._M_p = (pointer)paVar9;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b0,pcVar1,pcVar1 + fname->_M_string_length);
          set_writer(__return_storage_ptr__,this,(t_set *)tstruct,&local_b0);
          _Var8._M_p = local_b0._M_dataplus._M_p;
        }
        else {
          paVar9 = &local_90.field_2;
          pcVar1 = (fname->_M_dataplus)._M_p;
          local_90._M_dataplus._M_p = (pointer)paVar9;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_90,pcVar1,pcVar1 + fname->_M_string_length);
          list_writer(__return_storage_ptr__,this,(t_list *)tstruct,&local_90);
          _Var8._M_p = local_90._M_dataplus._M_p;
        }
      }
      else {
        paVar9 = &local_70.field_2;
        pcVar1 = (fname->_M_dataplus)._M_p;
        local_70._M_dataplus._M_p = (pointer)paVar9;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,pcVar1,pcVar1 + fname->_M_string_length);
        struct_writer(__return_storage_ptr__,this,tstruct,&local_70);
        _Var8._M_p = local_70._M_dataplus._M_p;
      }
    }
    else {
      paVar9 = &local_50.field_2;
      pcVar1 = (fname->_M_dataplus)._M_p;
      local_50._M_dataplus._M_p = (pointer)paVar9;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar1,pcVar1 + fname->_M_string_length);
      map_writer(__return_storage_ptr__,this,(t_map *)tstruct,&local_50);
      _Var8._M_p = local_50._M_dataplus._M_p;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var8._M_p == paVar9) {
      return __return_storage_ptr__;
    }
  }
  else {
    iVar3 = *(int *)&(tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                     _M_impl.super__Vector_impl_data._M_start;
    if (iVar3 - 3U < 4) {
      type_name_abi_cxx11_(&local_f0,this,(t_type *)tstruct);
      _Var8._M_p = local_f0._M_dataplus._M_p;
      iVar3 = toupper((int)*local_f0._M_dataplus._M_p);
      *_Var8._M_p = (char)iVar3;
      paVar9 = &local_f0.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p == paVar9) {
        local_c0._8_8_ = local_f0.field_2._8_8_;
        local_d0 = &local_c0;
      }
      else {
        local_d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_f0._M_dataplus._M_p;
      }
      local_c8 = local_f0._M_string_length;
      local_f0._M_string_length = 0;
      local_f0.field_2._M_local_buf[0] = '\0';
      local_f0._M_dataplus._M_p = (pointer)paVar9;
      puVar4 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,0x3a8d6b);
      psVar6 = puVar4 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_140._M_allocated_capacity = *psVar6;
        local_140._8_8_ = puVar4[3];
        local_150 = &local_140;
      }
      else {
        local_140._M_allocated_capacity = *psVar6;
        local_150 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar4;
      }
      local_148 = puVar4[1];
      *puVar4 = psVar6;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_150);
      plVar7 = plVar5 + 2;
      if ((long *)*plVar5 == plVar7) {
        local_120 = *plVar7;
        lStack_118 = plVar5[3];
        local_130 = &local_120;
      }
      else {
        local_120 = *plVar7;
        local_130 = (long *)*plVar5;
      }
      local_128 = plVar5[1];
      *plVar5 = (long)plVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      puVar4 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_130,(ulong)(fname->_M_dataplus)._M_p);
      psVar6 = puVar4 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_170.field_2._M_allocated_capacity = *psVar6;
        local_170.field_2._8_8_ = puVar4[3];
        local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
      }
      else {
        local_170.field_2._M_allocated_capacity = *psVar6;
        local_170._M_dataplus._M_p = (pointer)*puVar4;
      }
      local_170._M_string_length = puVar4[1];
      *puVar4 = psVar6;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_170);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar6 = (size_type *)(plVar5 + 2);
      if ((size_type *)*plVar5 == psVar6) {
        lVar2 = plVar5[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
      }
      __return_storage_ptr__->_M_string_length = plVar5[1];
      *plVar5 = (long)psVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != &local_170.field_2) {
        operator_delete(local_170._M_dataplus._M_p);
      }
      if (local_130 != &local_120) {
        operator_delete(local_130);
      }
      if (local_150 != &local_140) {
        operator_delete(local_150);
      }
      _Var8._M_p = local_f0._M_dataplus._M_p;
      if (local_d0 != &local_c0) {
        operator_delete(local_d0);
        _Var8._M_p = local_f0._M_dataplus._M_p;
      }
    }
    else {
      if (iVar3 == 7) {
        std::operator+(&local_170,"iprot writeDouble: ",fname);
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_170);
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        psVar6 = (size_type *)(plVar5 + 2);
        if ((size_type *)*plVar5 == psVar6) {
          lVar2 = plVar5[3];
          (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
          *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
          (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
        }
        __return_storage_ptr__->_M_string_length = plVar5[1];
        *plVar5 = (long)psVar6;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        _Var8._M_p = local_170._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._M_dataplus._M_p == &local_170.field_2) {
          return __return_storage_ptr__;
        }
        goto LAB_0034afa3;
      }
      type_name_abi_cxx11_(&local_110,this,(t_type *)tstruct);
      _Var8._M_p = local_110._M_dataplus._M_p;
      iVar3 = toupper((int)*local_110._M_dataplus._M_p);
      *_Var8._M_p = (char)iVar3;
      paVar9 = &local_110.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p == paVar9) {
        local_140._8_8_ = local_110.field_2._8_8_;
        local_150 = &local_140;
      }
      else {
        local_150 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_110._M_dataplus._M_p;
      }
      local_140._M_allocated_capacity._1_7_ = local_110.field_2._M_allocated_capacity._1_7_;
      local_140._M_local_buf[0] = local_110.field_2._M_local_buf[0];
      local_148 = local_110._M_string_length;
      local_110._M_string_length = 0;
      local_110.field_2._M_local_buf[0] = '\0';
      local_110._M_dataplus._M_p = (pointer)paVar9;
      puVar4 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_150,0,(char *)0x0,0x3a8d6b)
      ;
      plVar5 = puVar4 + 2;
      if ((long *)*puVar4 == plVar5) {
        local_120 = *plVar5;
        lStack_118 = puVar4[3];
        local_130 = &local_120;
      }
      else {
        local_120 = *plVar5;
        local_130 = (long *)*puVar4;
      }
      local_128 = puVar4[1];
      *puVar4 = plVar5;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_130);
      psVar6 = puVar4 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_170.field_2._M_allocated_capacity = *psVar6;
        local_170.field_2._8_8_ = puVar4[3];
        local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
      }
      else {
        local_170.field_2._M_allocated_capacity = *psVar6;
        local_170._M_dataplus._M_p = (pointer)*puVar4;
      }
      local_170._M_string_length = puVar4[1];
      *puVar4 = psVar6;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_170,(ulong)(fname->_M_dataplus)._M_p);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar6 = (size_type *)(plVar5 + 2);
      if ((size_type *)*plVar5 == psVar6) {
        lVar2 = plVar5[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
      }
      __return_storage_ptr__->_M_string_length = plVar5[1];
      *plVar5 = (long)psVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != &local_170.field_2) {
        operator_delete(local_170._M_dataplus._M_p);
      }
      if (local_130 != &local_120) {
        operator_delete(local_130);
      }
      _Var8._M_p = local_110._M_dataplus._M_p;
      if (local_150 != &local_140) {
        operator_delete(local_150);
        _Var8._M_p = local_110._M_dataplus._M_p;
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var8._M_p == paVar9) {
      return __return_storage_ptr__;
    }
  }
LAB_0034afa3:
  operator_delete(_Var8._M_p);
  return __return_storage_ptr__;
}

Assistant:

string t_st_generator::write_val(t_type* t, string fname) {
  t = get_true_type(t);

  if (t->is_base_type()) {
    t_base_type::t_base tbase = ((t_base_type*)t)->get_base();
    switch (tbase) {
    case t_base_type::TYPE_DOUBLE:
      return "iprot writeDouble: " + fname + " asFloat";
      break;
    case t_base_type::TYPE_I8:
    case t_base_type::TYPE_I16:
    case t_base_type::TYPE_I32:
    case t_base_type::TYPE_I64:
      return "iprot write" + capitalize(type_name(t)) + ": " + fname + " asInteger";
    default:
      return "iprot write" + capitalize(type_name(t)) + ": " + fname;
    }
  } else if (t->is_map()) {
    return map_writer((t_map*)t, fname);
  } else if (t->is_struct() || t->is_xception()) {
    return struct_writer((t_struct*)t, fname);
  } else if (t->is_list()) {
    return list_writer((t_list*)t, fname);
  } else if (t->is_set()) {
    return set_writer((t_set*)t, fname);
  } else if (t->is_enum()) {
    return "iprot writeI32: " + fname;
  } else {
    throw "Sorry, I don't know how to write this: " + type_name(t);
  }
}